

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O0

bool __thiscall DEnterKey::Responder(DEnterKey *this,event_t *ev)

{
  DMenu *pDVar1;
  undefined8 uVar2;
  event_t *ev_local;
  DEnterKey *this_local;
  
  if (ev->type == '\x01') {
    *this->pKey = (int)ev->data1;
    menuactive = MENU_On;
    SetMenuMessage(this,0);
    (*(this->super_DMenu).super_DObject._vptr_DObject[0xd])();
    pDVar1 = TObjPtr<DMenu>::operator->(&(this->super_DMenu).mParentMenu);
    uVar2 = 10;
    if (ev->data1 == 1) {
      uVar2 = 0xb;
    }
    (*(pDVar1->super_DObject)._vptr_DObject[8])(pDVar1,uVar2,0);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Responder(event_t *ev)
	{
		if (ev->type == EV_KeyDown)
		{
			*pKey = ev->data1;
			menuactive = MENU_On;
			SetMenuMessage(0);
			Close();
			mParentMenu->MenuEvent((ev->data1 == KEY_ESCAPE)? MKEY_Abort : MKEY_Input, 0);
			return true;
		}
		return false;
	}